

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  u32 uVar1;
  u32 uVar2;
  Btree *p;
  Pager *pPager_00;
  Pager *pPager_01;
  sqlite3_vfs *psVar3;
  sqlite3_file *psVar4;
  u32 *in_RCX;
  int in_EDX;
  long in_RDI;
  int nSave;
  int iNew;
  sqlite3_file *fd;
  Pager *pPager;
  Btree *pBtree;
  int rc;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc8;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  
  iVar6 = 1;
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14ed00);
  p = sqlite3DbNameToBtree(db_00,in_stack_ffffffffffffffc8);
  if (p != (Btree *)0x0) {
    sqlite3BtreeEnter((Btree *)0x14ed48);
    pPager_00 = sqlite3BtreePager(p);
    pPager_01 = (Pager *)sqlite3PagerFile(pPager_00);
    if (in_EDX == 7) {
      *(Pager **)in_RCX = pPager_01;
      iVar6 = 0;
    }
    else if (in_EDX == 0x1b) {
      psVar3 = sqlite3PagerVfs(pPager_00);
      *(sqlite3_vfs **)in_RCX = psVar3;
      iVar6 = 0;
    }
    else if (in_EDX == 0x1c) {
      psVar4 = sqlite3PagerJrnlFile(pPager_01);
      *(sqlite3_file **)in_RCX = psVar4;
      iVar6 = 0;
    }
    else if (in_EDX == 0x23) {
      uVar1 = sqlite3PagerDataVersion(pPager_00);
      *in_RCX = uVar1;
      iVar6 = 0;
    }
    else if (in_EDX == 0x26) {
      uVar1 = *in_RCX;
      uVar2 = sqlite3BtreeGetRequestedReserve((Btree *)pPager_01);
      *in_RCX = uVar2;
      if ((-1 < (int)uVar1) && ((int)uVar1 < 0x100)) {
        sqlite3BtreeSetPageSize
                  ((Btree *)CONCAT44(iVar6,in_stack_ffffffffffffffd8),(int)((ulong)p >> 0x20),(int)p
                   ,(int)((ulong)pPager_00 >> 0x20));
      }
      iVar6 = 0;
    }
    else if (in_EDX == 0x2a) {
      sqlite3BtreeClearCache((Btree *)pPager_01);
      iVar6 = 0;
    }
    else {
      uVar5 = *(undefined4 *)(in_RDI + 0x290);
      iVar6 = sqlite3OsFileControl
                        ((sqlite3_file *)pPager_00,(int)((ulong)pPager_01 >> 0x20),
                         (void *)CONCAT44(in_stack_ffffffffffffffbc,uVar5));
      *(undefined4 *)(in_RDI + 0x290) = uVar5;
    }
    sqlite3BtreeLeave((Btree *)0x14eeb4);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x14eec2);
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESET_CACHE ){
      sqlite3BtreeClearCache(pBtree);
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}